

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

void printDB(void)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  Person *pPVar4;
  reference pvVar5;
  ulong local_d0;
  size_t i;
  size_t j;
  vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> v;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [55];
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  Database db;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"sample.db",&local_49);
  hiberlite::Database::Database((Database *)local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  hiberlite::Database::registerBeanClass<Person>((Database *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,0xf,'=',
             (allocator *)
             ((long)&v.
                     super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::operator+(local_80,(char *)local_a0);
  std::operator<<((ostream *)&std::cout,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.
                     super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  hiberlite::Database::getAllBeans<Person>
            ((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> *)
             &j,(Database *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"found ");
  sVar2 = std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::
          size((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> *
               )&j);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1," persons in the database:\n");
  i = 0;
  while( true ) {
    sVar2 = std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
            ::size((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                    *)&j);
    if (sVar2 <= i) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"[name=");
    pvVar3 = std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
             ::operator[]((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                           *)&j,i);
    pPVar4 = hiberlite::bean_ptr<Person>::operator->(pvVar3);
    poVar1 = std::operator<<(poVar1,(string *)pPVar4);
    std::operator<<(poVar1,"\t");
    poVar1 = std::operator<<((ostream *)&std::cout,"age=");
    pvVar3 = std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
             ::operator[]((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                           *)&j,i);
    pPVar4 = hiberlite::bean_ptr<Person>::operator->(pvVar3);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pPVar4->age);
    std::operator<<(poVar1,"\t");
    std::operator<<((ostream *)&std::cout,"bio={");
    local_d0 = 0;
    while( true ) {
      pvVar3 = std::
               vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::
               operator[]((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                           *)&j,i);
      pPVar4 = hiberlite::bean_ptr<Person>::operator->(pvVar3);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pPVar4->bio);
      if (sVar2 <= local_d0) break;
      if (local_d0 != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,", ");
        std::ios::operator_cast_to_bool((ios *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18)));
      }
      pvVar3 = std::
               vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::
               operator[]((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                           *)&j,i);
      pPVar4 = hiberlite::bean_ptr<Person>::operator->(pvVar3);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&pPVar4->bio,local_d0);
      std::operator<<((ostream *)&std::cout,(string *)pvVar5);
      local_d0 = local_d0 + 1;
    }
    std::operator<<((ostream *)&std::cout,"}]\n");
    i = i + 1;
  }
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::~vector
            ((vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> *)
             &j);
  hiberlite::Database::~Database((Database *)local_28);
  return;
}

Assistant:

void printDB()
{
  hiberlite::Database db("sample.db");
  db.registerBeanClass<Person>();

  cout << string(15,'=')+"\nreading the DB\n";

  vector< hiberlite::bean_ptr<Person> > v=db.getAllBeans<Person>();

  cout << "found " << v.size() << " persons in the database:\n";

  for(size_t j=0;j<v.size();j++){
    cout << "[name=" << v[j]->name << "\t";
    cout << "age=" << v[j]->age << "\t";
    cout << "bio={";
    for(size_t i=0;i<v[j]->bio.size();i++)
      i && cout << ", ", cout << v[j]->bio[i];
    cout << "}]\n";
  }
}